

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmCommandName * __thiscall
cmCommandContext::cmCommandName::operator=(cmCommandName *this,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  cmCommandName *this_local;
  
  local_18 = name;
  name_local = &this->Lower;
  std::__cxx11::string::operator=((string *)&this->Original,(string *)name);
  cmsys::SystemTools::LowerCase(&local_38,local_18);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

cmCommandContext::cmCommandName& cmCommandContext::cmCommandName::operator=(
  std::string const& name)
{
  this->Original = name;
  this->Lower = cmSystemTools::LowerCase(name);
  return *this;
}